

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io_error.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  error e;
  status_code_storage<system_error2::detail::erased<long,_true>_> local_90;
  string_ref local_80;
  string_ref local_50;
  
  local_90 = (status_code_storage<system_error2::detail::erased<long,_true>_>)open_resource();
  (**(local_90.super_status_code<void>._domain._domain)->_vptr_status_code_domain)
            (&local_80,local_90.super_status_code<void>._domain._domain);
  system_error2::status_code<void>::message(&local_50,&local_90.super_status_code<void>);
  printf("Returned error has a code domain of \'%s\', a message of \'%s\'\n",
         CONCAT44(local_80._begin._4_4_,local_80._begin._0_4_),local_50._begin);
  system_error2::status_code_domain::string_ref::~string_ref(&local_50);
  system_error2::status_code_domain::string_ref::~string_ref(&local_80);
  local_80._begin._0_4_ = 1;
  bVar1 = system_error2::
          operator==<system_error2::detail::erased<long,_true>,_system_error2::errc,_system_error2::status_code<system_error2::_generic_code_domain>,_true>
                    ((errored_status_code<system_error2::detail::erased<long,_true>_> *)&local_90,
                     (errc *)&local_80);
  printf("\nAnd semantically comparing it to \'errc::operation_not_permitted\' = %d\n",(ulong)bVar1)
  ;
  system_error2::status_code<system_error2::detail::erased<long,_true>_>::~status_code
            ((status_code<system_error2::detail::erased<long,_true>_> *)&local_90);
  return 0;
}

Assistant:

int main(void)
{
  error e = open_resource();
  // A quick demonstration that the indirection works as indicated
  printf("Returned error has a code domain of '%s', a message of '%s'\n", e.domain().name().c_str(), e.message().c_str());
  printf("\nAnd semantically comparing it to 'errc::operation_not_permitted' = %d\n", e == errc::operation_not_permitted);
}